

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::post_init_state(NavierStokesBase *this)

{
  int iVar1;
  NavierStokesBase *pNVar2;
  long in_RDI;
  int k_1;
  int k;
  int in_stack_000007f0;
  int in_stack_000007f4;
  Real in_stack_000007f8;
  int in_stack_00000804;
  Projection *in_stack_00000808;
  Real divu_time;
  int finest_level;
  undefined4 in_stack_fffffffffffff618;
  int in_stack_fffffffffffff61c;
  NavierStokesBase *in_stack_fffffffffffff620;
  Print *this_00;
  char *in_stack_fffffffffffff630;
  StateData *in_stack_fffffffffffff640;
  Print *in_stack_fffffffffffff648;
  NavierStokesBase *in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff694;
  Print local_968 [2];
  int local_654;
  int in_stack_fffffffffffffd8c;
  Projection *in_stack_fffffffffffffd90;
  
  iVar1 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
  if (have_divu == 0) {
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffff620,
               CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
    amrex::StateData::curTime(in_stack_fffffffffffff640);
  }
  else {
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffff620,
               CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
    amrex::StateData::curTime(in_stack_fffffffffffff640);
  }
  if (do_init_vort_proj != 0) {
    amrex::Abort_host(in_stack_fffffffffffff630);
    if (verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print((Print *)in_stack_fffffffffffff650,(ostream *)in_stack_fffffffffffff648);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff620,
                 (char (*) [32])CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff620,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
    }
    Projection::initialVorticityProject
              ((Projection *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),0);
    if (verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print((Print *)in_stack_fffffffffffff650,(ostream *)in_stack_fffffffffffff648);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff620,
                 (char (*) [37])CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff620,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
    }
  }
  if ((do_init_proj != 0) && (projector != (Projection *)0x0)) {
    if (verbose != 0) {
      amrex::OutStream();
      in_stack_fffffffffffff650 = (NavierStokesBase *)&stack0xfffffffffffffb38;
      amrex::Print::Print((Print *)in_stack_fffffffffffff650,(ostream *)in_stack_fffffffffffff648);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff620,
                 (char (*) [31])CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff620,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
    }
    Projection::initialVelocityProject
              (in_stack_00000808,in_stack_00000804,in_stack_000007f8,in_stack_000007f4,
               in_stack_000007f0);
    if (verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print((Print *)in_stack_fffffffffffff650,(ostream *)in_stack_fffffffffffff648);
      in_stack_fffffffffffff648 =
           amrex::Print::operator<<
                     ((Print *)in_stack_fffffffffffff620,
                      (char (*) [36])CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff620,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
    }
  }
  initial_step = 1;
  local_654 = iVar1;
  while (local_654 = local_654 + -1, -1 < local_654) {
    pNVar2 = getLevel(in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
    (*(pNVar2->super_AmrLevel)._vptr_AmrLevel[0x2c])();
  }
  if (((do_init_proj != 0) && (projector != (Projection *)0x0)) && (0.0 < ABS(gravity))) {
    if (verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print((Print *)in_stack_fffffffffffff650,(ostream *)in_stack_fffffffffffff648);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff620,
                 (char (*) [31])CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff620,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
    }
    Projection::initialPressureProject(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    if (verbose != 0) {
      amrex::OutStream();
      this_00 = local_968;
      amrex::Print::Print((Print *)in_stack_fffffffffffff650,(ostream *)in_stack_fffffffffffff648);
      amrex::Print::operator<<
                (this_00,(char (*) [36])
                         CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::operator<<
                (this_00,(_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                          *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
    }
  }
  if (do_init_proj == 0) {
    for (; -1 < iVar1; iVar1 = iVar1 + -1) {
      initOldFromNew(in_stack_fffffffffffff650,(int)((ulong)in_stack_fffffffffffff648 >> 0x20),
                     (int)in_stack_fffffffffffff648);
      initOldFromNew(in_stack_fffffffffffff650,(int)((ulong)in_stack_fffffffffffff648 >> 0x20),
                     (int)in_stack_fffffffffffff648);
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::post_init_state ()
{
    const int finest_level = parent->finestLevel();
    const Real divu_time   = have_divu ? state[Divu_Type].curTime()
                                       : state[Press_Type].curTime();

    if (do_init_vort_proj)
    {
        amrex::Abort("NavierStokesBase::post_init_state(): initialVorticityProject not tested with new Gradp!!! See comments Projection::initialVorticityProject.\n");
        //
	// NOTE: this assumes have_divu == 0.
	// Only used if vorticity is used to initialize the velocity field.
        //
        AMREX_ASSERT(!(projector == 0));

	if (verbose) amrex::Print() << "calling initialVorticityProject" << std::endl;

	projector->initialVorticityProject(0);

	if (verbose) amrex::Print() << "done calling initialVorticityProject" << std::endl;
    }

    if (do_init_proj && projector)
    {
      //
      // Do sync project to define divergence free velocity field.
      //
      if (verbose) amrex::Print() << "calling initialVelocityProject" << std::endl;

      projector->initialVelocityProject(0,divu_time,have_divu,init_vel_iter);

      if (verbose) amrex::Print() << "done calling initialVelocityProject" << std::endl;
    }

    NavierStokesBase::initial_step = true;
    //
    // Average velocity and scalar data down from finer levels
    // so that conserved data is consistant between levels.
    // This might not be the most efficient way of doing things
    // (since initialVelocityProject will average down vel, P and Gradp),
    // but it does ensure everything is averaged down for all cases
    // (e.g. initialVelocityProject doesn't get called or init_vel_iter<=0).
    //
    for (int k = finest_level-1; k>= 0; k--)
    {
      getLevel(k).avgDown();
    }

    if (do_init_proj && projector && (std::fabs(gravity)) > 0.){
      //
      // Do projection to establish initially hydrostatic pressure field.
      //
      if (verbose) amrex::Print() << "calling initialPressureProject" << std::endl;

      projector->initialPressureProject(0);

      if (verbose) amrex::Print() << "done calling initialPressureProject" << std::endl;
    }
    //
    // Make sure there's not NANs in old pressure field.
    // End up with P_old = P_new as is the case when exiting initialPressureProject
    //
    if(!do_init_proj)
    {
      for (int k = finest_level; k>= 0; k--)
      {
	initOldFromNew(Press_Type, k);
	initOldFromNew(Gradp_Type, k);
    }
    }
}